

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLleftForest(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *vec,int *param_2,
                  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *param_3)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pnVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  long lVar9;
  type_conflict5 tVar10;
  cpp_dec_float<50U,_int,_void> *v;
  int iVar11;
  int *piVar12;
  long lVar13;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  pnVar5 = (this->l).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar6 = (this->l).idx;
  piVar7 = (this->l).row;
  piVar8 = (this->l).start;
  iVar2 = (this->l).firstUpdate;
  lVar9 = (long)(this->l).firstUnused;
  while (lVar13 = lVar9, iVar2 < lVar13) {
    iVar3 = piVar7[lVar13 + -1];
    local_a8.data._M_elems._32_8_ = *(undefined8 *)(vec[iVar3].m_backend.data._M_elems + 8);
    local_a8.data._M_elems._0_8_ = *(undefined8 *)vec[iVar3].m_backend.data._M_elems;
    local_a8.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar3].m_backend.data._M_elems + 2);
    puVar1 = vec[iVar3].m_backend.data._M_elems + 4;
    local_a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_a8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_a8.exp = vec[iVar3].m_backend.exp;
    local_a8.neg = vec[iVar3].m_backend.neg;
    local_a8.fpclass = vec[iVar3].m_backend.fpclass;
    local_a8.prec_elem = vec[iVar3].m_backend.prec_elem;
    local_68.data._M_elems[0] = 0;
    local_68.data._M_elems[1] = 0;
    tVar10 = boost::multiprecision::operator!=
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_a8,(double *)&local_68);
    lVar9 = lVar13 + -1;
    if (tVar10) {
      iVar3 = piVar8[lVar13 + -1];
      piVar12 = piVar6 + iVar3;
      v = &pnVar5[iVar3].m_backend;
      for (iVar11 = piVar8[lVar13]; iVar3 < iVar11; iVar11 = iVar11 + -1) {
        local_68.fpclass = cpp_dec_float_finite;
        local_68.prec_elem = 10;
        local_68.data._M_elems[0] = 0;
        local_68.data._M_elems[1] = 0;
        local_68.data._M_elems[2] = 0;
        local_68.data._M_elems[3] = 0;
        local_68.data._M_elems[4] = 0;
        local_68.data._M_elems[5] = 0;
        local_68.data._M_elems._24_5_ = 0;
        local_68.data._M_elems[7]._1_3_ = 0;
        local_68.data._M_elems._32_5_ = 0;
        local_68._37_8_ = 0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_68,&local_a8,v);
        iVar4 = *piVar12;
        piVar12 = piVar12 + 1;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&vec[iVar4].m_backend,&local_68);
        v = v + 1;
      }
    }
  }
  return 0;
}

Assistant:

int CLUFactor<R>::solveLleftForest(R* vec, int* /* nonz */, R /* eps */)
{
   int i, j, k, end;
   R x;
   R* val, *lval;
   int* idx, *lidx, *lrow, *lbeg;

   lval = l.val.data();
   lidx = l.idx;
   lrow = l.row;
   lbeg = l.start;

   end = l.firstUpdate;

   for(i = l.firstUnused - 1; i >= end; --i)
   {
      if((x = vec[lrow[i]]) != 0.0)
      {
         k = lbeg[i];
         val = &lval[k];
         idx = &lidx[k];

         for(j = lbeg[i + 1]; j > k; --j)
            vec[*idx++] -= x * (*val++);
      }
   }

   return 0;
}